

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Matrix * rw::Matrix::invert(Matrix *dst,Matrix *src)

{
  Matrix *src_local;
  Matrix *dst_local;
  
  dst_local = dst;
  if ((src->flags & 0x20000) == 0) {
    if ((src->flags & 3) == 3) {
      invertOrthonormal(dst,src);
    }
    else {
      dst_local = invertGeneral(dst,src);
    }
  }
  else {
    memcpy(dst,src,0x40);
  }
  return dst_local;
}

Assistant:

Matrix*
Matrix::invert(Matrix *dst, const Matrix *src)
{
	if(src->flags & IDENTITY)
		*dst = *src;
	else if((src->flags & TYPEMASK) == TYPEORTHONORMAL)
		invertOrthonormal(dst, src);
	else
		return invertGeneral(dst, src);
	return dst;
}